

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::uniformv
          (ReferenceContext *this,deInt32 location,DataType type,deInt32 count,void *v)

{
  deBool dVar1;
  int iVar2;
  vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_> *this_00;
  size_type sVar3;
  reference pvVar4;
  int scalarSize;
  vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_> *uniforms;
  void *v_local;
  deInt32 count_local;
  DataType type_local;
  deInt32 location_local;
  ReferenceContext *this_local;
  
  do {
    if (this->m_currentProgram == (ShaderProgramObjectContainer *)0x0) {
      setError(this,0x502);
      return;
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  this_00 = &this->m_currentProgram->m_program->m_uniforms;
  if (location != -1) {
    do {
      if ((location < 0) ||
         (sVar3 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::size(this_00),
         sVar3 <= (ulong)(long)location)) {
        setError(this,0x502);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      pvVar4 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                         (this_00,(long)location);
      if (pvVar4->type != type) {
        setError(this,0x502);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    do {
      if (count != 1) {
        setError(this,0x502);
        return;
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    iVar2 = glu::getDataTypeScalarSize(type);
    pvVar4 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                       (this_00,(long)location);
    ::deMemcpy(&pvVar4->value,v,(long)(iVar2 << 2));
  }
  return;
}

Assistant:

void ReferenceContext::uniformv (deInt32 location, glu::DataType type, deInt32 count, const void* v)
{
	RC_IF_ERROR(m_currentProgram == DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);

	std::vector<sglr::UniformSlot>& uniforms = m_currentProgram->m_program->m_uniforms;

	if (location == -1)
		return;

	RC_IF_ERROR(location < 0 || (size_t)location >= uniforms.size(), GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(uniforms[location].type != type, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(count != 1, GL_INVALID_OPERATION, RC_RET_VOID); // \todo [2013-12-13 pyry] Array uniforms.

	{
		const int scalarSize = glu::getDataTypeScalarSize(type);
		DE_ASSERT(scalarSize*sizeof(deUint32) <= sizeof(uniforms[location].value));
		deMemcpy(&uniforms[location].value, v, scalarSize*(int)sizeof(deUint32));
	}
}